

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationY<std::complex<float>_>::apply
          (RotationY<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  complex<float> *pcVar2;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_00;
  double __x;
  double __x_00;
  double dVar3;
  undefined1 local_40 [8];
  anon_class_24_4_61ab1aa0_conflict f;
  int qubit;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  RotationY<std::complex<float>_> *this_local;
  
  vector_00 = vector;
  f._20_4_ = offset;
  iVar1 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  f.s2 = (float)(iVar1 + f._20_4_);
  __x_00 = QRotationGate1<std::complex<float>_>::cos
                     (&this->super_QRotationGate1<std::complex<float>_>,__x);
  dVar3 = QRotationGate1<std::complex<float>_>::sin
                    (&this->super_QRotationGate1<std::complex<float>_>,__x_00);
  pcVar2 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  lambda_RotationY<std::complex<float>,float>
            ((anon_class_24_4_61ab1aa0_conflict *)local_40,(qgates *)(ulong)(uint)(int)(char)op,
             (Op)pcVar2,SUB84(__x_00,0),SUB84(dVar3,0),(complex<float> *)vector_00);
  apply2<qclab::qgates::lambda_RotationY<std::complex<float>,float>(qclab::Op,float,float,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,(int)f.s2,(anon_class_24_4_61ab1aa0_conflict *)local_40);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }